

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O0

string * __thiscall
cfgfile::tag_scalar_t<int,cfgfile::string_trait_t>::print_abi_cxx11_
          (tag_scalar_t<int,_cfgfile::string_trait_t> *this,int indent)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  reference pptVar5;
  int in_EDX;
  tag_t<cfgfile::string_trait_t> *in_RSI;
  char cVar6;
  string *in_RDI;
  string_t *in_stack_00000098;
  tag_t<cfgfile::string_trait_t> *tag;
  const_iterator __end0;
  const_iterator __begin0;
  child_tags_list_t *__range4;
  string_t value;
  string_t *result;
  vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
  *in_stack_fffffffffffffe98;
  __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
  *in_stack_fffffffffffffea0;
  vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
  *in_stack_fffffffffffffeb0;
  allocator *paVar7;
  tag_t<cfgfile::string_trait_t> *in_stack_fffffffffffffeb8;
  allocator local_f1;
  string local_f0 [32];
  string local_d0 [32];
  tag_t<cfgfile::string_trait_t> *local_b0;
  tag_t<cfgfile::string_trait_t> **local_a8;
  __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
  local_a0;
  undefined8 local_98;
  string local_90 [32];
  string local_70 [39];
  allocator local_49;
  string local_48 [51];
  undefined1 local_15;
  int local_14;
  
  local_15 = 0;
  local_14 = in_EDX;
  std::__cxx11::string::string(in_RDI);
  bVar2 = tag_t<cfgfile::string_trait_t>::is_defined(in_stack_fffffffffffffeb8);
  cVar6 = const_t<cfgfile::string_trait_t>::c_tab;
  if (bVar2) {
    uVar4 = (ulong)local_14;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,uVar4,cVar6,&local_49);
    std::__cxx11::string::append(in_RDI);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    cVar6 = (char)in_RDI;
    std::__cxx11::string::push_back(cVar6);
    tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(in_RSI);
    std::__cxx11::string::append(in_RDI);
    std::__cxx11::string::push_back(cVar6);
    format_t<int,cfgfile::string_trait_t>::to_string_abi_cxx11_((int *)in_stack_fffffffffffffe98);
    to_cfgfile_format<cfgfile::string_trait_t>(in_stack_00000098);
    std::__cxx11::string::operator=(local_70,local_90);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::append(in_RDI);
    (*in_RSI->_vptr_tag_t[2])();
    bVar2 = std::
            vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
            ::empty(in_stack_fffffffffffffeb0);
    if (!bVar2) {
      std::__cxx11::string::push_back(cVar6);
      iVar3 = (*in_RSI->_vptr_tag_t[2])();
      local_98 = CONCAT44(extraout_var,iVar3);
      local_a0._M_current =
           (tag_t<cfgfile::string_trait_t> **)
           std::
           vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
           ::begin(in_stack_fffffffffffffe98);
      local_a8 = (tag_t<cfgfile::string_trait_t> **)
                 std::
                 vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                 ::end(in_stack_fffffffffffffe98);
      while (bVar2 = __gnu_cxx::operator!=
                               (in_stack_fffffffffffffea0,
                                (__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                                 *)in_stack_fffffffffffffe98),
            cVar1 = const_t<cfgfile::string_trait_t>::c_tab, bVar2) {
        pptVar5 = __gnu_cxx::
                  __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                  ::operator*(&local_a0);
        local_b0 = *pptVar5;
        (*local_b0->_vptr_tag_t[3])(local_d0,local_b0,(ulong)(local_14 + 1));
        std::__cxx11::string::append(in_RDI);
        std::__cxx11::string::~string(local_d0);
        __gnu_cxx::
        __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
        ::operator++(&local_a0);
      }
      uVar4 = (ulong)local_14;
      paVar7 = &local_f1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f0,uVar4,cVar1,paVar7);
      std::__cxx11::string::append(in_RDI);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    }
    std::__cxx11::string::push_back(cVar6);
    std::__cxx11::string::push_back(cVar6);
    std::__cxx11::string::~string(local_70);
  }
  return in_RDI;
}

Assistant:

typename Trait::string_t print( int indent = 0 ) const override
	{
		typename Trait::string_t result;

		if( this->is_defined() )
		{
			result.append( typename Trait::string_t( indent,
				const_t< Trait >::c_tab ) );

			result.push_back( const_t< Trait >::c_begin_tag );
			result.append( this->name() );
			result.push_back( const_t< Trait >::c_space );

			typename Trait::string_t value =
				format_t< T, Trait >::to_string( m_value );
			value = to_cfgfile_format< Trait >( value );

			result.append( value );

			if( !this->children().empty() )
			{
				result.push_back( const_t< Trait >::c_carriage_return );

				for( const tag_t< Trait > * tag : this->children() )
					result.append( tag->print( indent + 1 ) );

				result.append( typename Trait::string_t( indent,
					const_t< Trait >::c_tab ) );
			}

			result.push_back( const_t< Trait >::c_end_tag );
			result.push_back( const_t< Trait >::c_carriage_return );
		}

		return result;
	}